

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O3

double soplex::maxPrescaledRatio<double>
                 (SPxLPBase<double> *lp,vector<double,_std::allocator<double>_> *coScaleval,
                 bool rowRatio)

{
  double dVar1;
  uint uVar2;
  Tolerances *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  LPRowSetBase<double> *pLVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  undefined3 in_register_00000011;
  long *plVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  double dVar11;
  Real RVar12;
  double dVar13;
  double local_90;
  double local_88;
  double local_80;
  
  pLVar3 = (LPRowSetBase<double> *)&lp->super_LPColSetBase<double>;
  if (CONCAT31(in_register_00000011,rowRatio) != 0) {
    pLVar3 = &lp->super_LPRowSetBase<double>;
  }
  uVar2 = (pLVar3->super_SVSetBase<double>).set.thenum;
  if ((int)uVar2 < 1) {
    local_90 = 0.0;
  }
  else {
    dVar1 = *(double *)(in_FS_OFFSET + -8);
    lVar5 = 0xe8;
    if (rowRatio) {
      lVar5 = 0x20;
    }
    lVar6 = 0xf0;
    if (rowRatio) {
      lVar6 = 0x28;
    }
    local_90 = 0.0;
    uVar10 = 0;
    do {
      plVar7 = (long *)((long)*(int *)(*(long *)((long)&(lp->super_LPRowSetBase<double>).
                                                        super_SVSetBase<double>.
                                                        super_ClassArray<soplex::Nonzero<double>_>.
                                                        _vptr_ClassArray + lVar6) + 4 + uVar10 * 8)
                        * 0x28 + *(long *)((long)&(lp->super_LPRowSetBase<double>).
                                                  super_SVSetBase<double>.
                                                  super_ClassArray<soplex::Nonzero<double>_>.
                                                  _vptr_ClassArray + lVar5));
      ::soplex::infinity::__tls_init();
      local_80 = dVar1;
      if (*(int *)((long)plVar7 + 0xc) < 1) {
        local_88 = 0.0;
      }
      else {
        local_88 = 0.0;
        lVar9 = 8;
        lVar8 = 0;
        do {
          dVar11 = ABS(*(double *)(*plVar7 + -8 + lVar9)) *
                   (coScaleval->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start[*(uint *)(*plVar7 + lVar9)];
          this = (lp->_tolerances).
                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_00 = (lp->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_00->_M_use_count = this_00->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_00->_M_use_count = this_00->_M_use_count + 1;
            }
          }
          RVar12 = Tolerances::epsilon(this);
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          dVar4 = local_88;
          if (RVar12 < ABS(dVar11)) {
            dVar13 = dVar11;
            if (local_80 <= dVar11) {
              dVar13 = local_80;
            }
            dVar4 = dVar11;
            local_80 = dVar13;
            if (dVar11 <= local_88) {
              dVar4 = local_88;
            }
          }
          local_88 = dVar4;
          lVar8 = lVar8 + 1;
          lVar9 = lVar9 + 0x10;
        } while (lVar8 < *(int *)((long)plVar7 + 0xc));
      }
      ::soplex::infinity::__tls_init();
      if (((local_80 != dVar1) || (dVar11 = local_90, NAN(local_80) || NAN(dVar1))) &&
         (dVar11 = local_88 / local_80, local_88 / local_80 <= local_90)) {
        dVar11 = local_90;
      }
      local_90 = dVar11;
      uVar10 = uVar10 + 1;
    } while (uVar10 != uVar2);
  }
  return local_90;
}

Assistant:

static R maxPrescaledRatio(const SPxLPBase<R>& lp, const std::vector<R>& coScaleval, bool rowRatio)
{
   R pmax = 0.0;
   const int n = rowRatio ? lp.nRows() : lp.nCols();

   for(int i = 0; i < n; ++i)
   {
      const SVectorBase<R>& vec = rowRatio ? lp.rowVector(i) : lp.colVector(i);
      R mini = R(infinity);
      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         assert(vec.index(j) >= 0);
         const R x = spxAbs(vec.value(j)) * coScaleval[unsigned(vec.index(j))];

         if(isZero(x, lp.tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}